

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexMathFloatExc.cpp
# Opt level: O3

void Iex_3_2::anon_unknown_10::fpeHandler(int type,char *explanation)

{
  MathExc *this;
  pointer_____offset_0x10___ *ppuVar1;
  
  this = (MathExc *)__cxa_allocate_exception(0x48);
  switch(type) {
  case 1:
    OverflowExc::OverflowExc((OverflowExc *)this,explanation);
    ppuVar1 = &OverflowExc::typeinfo;
    break;
  case 2:
    UnderflowExc::UnderflowExc((UnderflowExc *)this,explanation);
    ppuVar1 = &UnderflowExc::typeinfo;
    break;
  case 4:
    DivzeroExc::DivzeroExc((DivzeroExc *)this,explanation);
    ppuVar1 = &DivzeroExc::typeinfo;
    break;
  case 8:
    InexactExc::InexactExc((InexactExc *)this,explanation);
    ppuVar1 = &InexactExc::typeinfo;
    break;
  default:
    if (type == 0x10) {
      InvalidFpOpExc::InvalidFpOpExc((InvalidFpOpExc *)this,explanation);
      ppuVar1 = &InvalidFpOpExc::typeinfo;
      break;
    }
  case 3:
  case 5:
  case 6:
  case 7:
    MathExc::MathExc(this,explanation);
    ppuVar1 = &MathExc::typeinfo;
  }
  __cxa_throw(this,ppuVar1,EdircorruptedExc::~EdircorruptedExc);
}

Assistant:

void
fpeHandler (int type, const char explanation[])
{
    switch (type)
    {
        case IEEE_OVERFLOW: throw OverflowExc (explanation);

        case IEEE_UNDERFLOW: throw UnderflowExc (explanation);

        case IEEE_DIVZERO: throw DivzeroExc (explanation);

        case IEEE_INEXACT: throw InexactExc (explanation);

        case IEEE_INVALID: throw InvalidFpOpExc (explanation);
    }

    throw MathExc (explanation);
}